

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

void __thiscall CBinds::Bind(CBinds *this,int KeyID,int Modifier,char *pStr)

{
  long lVar1;
  char *pcVar2;
  IInput *pIVar3;
  char *pcVar4;
  IConsole *pIVar5;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  char aBuf [256];
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char local_108 [96];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((-1 < (int)in_ESI) && ((int)in_ESI < 0x1da)) {
    str_copy(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0);
    if (*(char *)(in_RDI + 0x28 + (long)(int)in_ESI * 0x200 + (long)in_EDX * 0x80) == '\0') {
      pcVar2 = GetModifierName(in_EDX);
      pIVar3 = CComponent::Input((CComponent *)0x1474e6);
      pcVar4 = IInput::KeyName(pIVar3,in_ESI);
      str_format(local_108,0x100,"unbound %s%s (%d)",pcVar2,pcVar4,(ulong)in_ESI);
    }
    else {
      pcVar2 = GetModifierName(in_EDX);
      pIVar3 = CComponent::Input((CComponent *)0x14753b);
      pcVar4 = IInput::KeyName(pIVar3,in_ESI);
      str_format(local_108,0x100,"bound %s%s (%d) = %s",pcVar2,pcVar4,(ulong)in_ESI,
                 in_RDI + 0x28 + (long)(int)in_ESI * 0x200 + (long)in_EDX * 0x80);
    }
    pIVar5 = CComponent::Console((CComponent *)0x14759b);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])(pIVar5,0,"binds",local_108);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CBinds::Bind(int KeyID, int Modifier, const char *pStr)
{
	if(KeyID < 0 || KeyID >= KEY_LAST)
		return;

	str_copy(m_aaaKeyBindings[KeyID][Modifier], pStr, sizeof(m_aaaKeyBindings[KeyID][Modifier]));
	char aBuf[256];
	if(!m_aaaKeyBindings[KeyID][Modifier][0])
		str_format(aBuf, sizeof(aBuf), "unbound %s%s (%d)", GetModifierName(Modifier),Input()->KeyName(KeyID), KeyID);
	else
		str_format(aBuf, sizeof(aBuf), "bound %s%s (%d) = %s", GetModifierName(Modifier),Input()->KeyName(KeyID), KeyID, m_aaaKeyBindings[KeyID][Modifier]);
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "binds", aBuf);
}